

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall
CCoinsViewErrorCatcher::GetCoin(CCoinsViewErrorCatcher *this,COutPoint *outpoint,Coin *coin)

{
  long lVar1;
  int iVar2;
  function<void_()> *f;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (**((this->super_CCoinsViewBacked).base)->_vptr_CCoinsView)();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsViewErrorCatcher::GetCoin(const COutPoint &outpoint, Coin &coin) const {
    return ExecuteBackedWrapper([&]() { return CCoinsViewBacked::GetCoin(outpoint, coin); }, m_err_callbacks);
}